

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall Catch::Matchers::WithinUlpsMatcher::match(WithinUlpsMatcher *this,double *matchee)

{
  ulong uVar1;
  ulong uVar2;
  ReusableStringStream RStack_48;
  string local_38;
  SourceLineInfo local_18;
  
  if (this->m_type == Double) {
    if (NAN(*matchee) || NAN(this->m_target)) {
      return false;
    }
    uVar2 = this->m_ulps;
    uVar1 = ulpDistance<double>(*matchee,this->m_target);
  }
  else {
    if (this->m_type != Float) {
      ReusableStringStream::ReusableStringStream(&RStack_48);
      local_18.file =
           "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
      ;
      local_18.line = 0x1de9;
      Catch::operator<<(RStack_48.m_oss,&local_18);
      std::operator<<(RStack_48.m_oss,": Internal Catch2 error: ");
      std::operator<<(RStack_48.m_oss,"Unknown Detail::FloatingPointKind value");
      std::__cxx11::stringbuf::str();
      throw_logic_error(&local_38);
    }
    if (NAN((float)*matchee) || NAN((float)this->m_target)) {
      return false;
    }
    uVar2 = this->m_ulps;
    uVar1 = ulpDistance<float>((float)*matchee,(float)this->m_target);
  }
  return uVar1 <= uVar2;
}

Assistant:

bool WithinUlpsMatcher::match(double const& matchee) const {
        switch (m_type) {
        case Detail::FloatingPointKind::Float:
            return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
        case Detail::FloatingPointKind::Double:
            return almostEqualUlps<double>(matchee, m_target, m_ulps);
        default:
            CATCH_INTERNAL_ERROR( "Unknown Detail::FloatingPointKind value" );
        }
    }